

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPServer.cpp
# Opt level: O0

void __thiscall SocketPP::TCPServer::disconnectAllStreams(TCPServer *this)

{
  bool bVar1;
  reference pTVar2;
  iterator iStack_30;
  TCPStream stream;
  iterator __end1;
  iterator __begin1;
  vector<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_> *__range1;
  lock_guard<std::mutex> lockStream;
  TCPServer *this_local;
  
  lockStream._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&__range1,&this->streamMutex_);
  __end1 = std::vector<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>::begin
                     (&this->connectedStreams_);
  iStack_30 = std::vector<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>::end
                        (&this->connectedStreams_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffd0);
    if (!bVar1) break;
    pTVar2 = __gnu_cxx::
             __normal_iterator<SocketPP::TCPStream_*,_std::vector<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>_>
             ::operator*(&__end1);
    (*(this->super_SocketServer).super_Socket._vptr_Socket[1])(this,(ulong)(uint)pTVar2->fd);
    __gnu_cxx::
    __normal_iterator<SocketPP::TCPStream_*,_std::vector<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>_>
    ::operator++(&__end1);
  }
  std::vector<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>::clear
            (&this->connectedStreams_);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&__range1);
  return;
}

Assistant:

void TCPServer::disconnectAllStreams() {
    std::lock_guard<std::mutex> lockStream(streamMutex_);

    for (auto stream:connectedStreams_) {
        onDisconnected(stream.fd);
    }
    connectedStreams_.clear();
}